

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMessage
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  long lVar1;
  MessageOptions *pMVar2;
  Type *proto_00;
  Type *proto_01;
  Type *pTVar3;
  long lVar4;
  int i_3;
  int i;
  long lVar5;
  
  if (*(long *)(message + 0x20) == 0) {
    pMVar2 = MessageOptions::default_instance();
    *(MessageOptions **)(message + 0x20) = pMVar2;
  }
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(message + 0x38); lVar5 = lVar5 + 1) {
    lVar1 = *(long *)(message + 0x40);
    proto_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&(proto->nested_type_).super_RepeatedPtrFieldBase,(int)lVar5);
    CrossLinkMessage(this,(Descriptor *)(lVar1 + lVar4),proto_00);
    lVar4 = lVar4 + 0x78;
  }
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(message + 0x48); lVar5 = lVar5 + 1) {
    lVar1 = *(long *)(message + 0x50);
    proto_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(proto->enum_type_).super_RepeatedPtrFieldBase,(int)lVar5);
    CrossLinkEnum(this,(EnumDescriptor *)(lVar1 + lVar4),proto_01);
    lVar4 = lVar4 + 0x38;
  }
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(message + 0x2c); lVar5 = lVar5 + 1) {
    lVar1 = *(long *)(message + 0x30);
    pTVar3 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(proto->field_).super_RepeatedPtrFieldBase,(int)lVar5);
    CrossLinkField(this,(FieldDescriptor *)(lVar1 + lVar4),pTVar3);
    lVar4 = lVar4 + 0x78;
  }
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(message + 0x68); lVar5 = lVar5 + 1) {
    lVar1 = *(long *)(message + 0x70);
    pTVar3 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(proto->extension_).super_RepeatedPtrFieldBase,(int)lVar5);
    CrossLinkField(this,(FieldDescriptor *)(lVar1 + lVar4),pTVar3);
    lVar4 = lVar4 + 0x78;
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMessage(
    Descriptor* message, const DescriptorProto& proto) {
  if (message->options_ == NULL) {
    message->options_ = &MessageOptions::default_instance();
  }

  for (int i = 0; i < message->nested_type_count(); i++) {
    CrossLinkMessage(&message->nested_types_[i], proto.nested_type(i));
  }

  for (int i = 0; i < message->enum_type_count(); i++) {
    CrossLinkEnum(&message->enum_types_[i], proto.enum_type(i));
  }

  for (int i = 0; i < message->field_count(); i++) {
    CrossLinkField(&message->fields_[i], proto.field(i));
  }

  for (int i = 0; i < message->extension_count(); i++) {
    CrossLinkField(&message->extensions_[i], proto.extension(i));
  }
}